

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall Buffer_change_event_copyout_Test::TestBody(Buffer_change_event_copyout_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  int wanted;
  array<char,_8UL> array;
  BufferWithReadonlyStrings local;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  AssertHelper local_f0;
  internal local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  int local_d4;
  undefined8 local_d0;
  BufferWithReadonlyStrings local_c8;
  
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_c8);
  local_d4 = 8;
  local_d0 = 0;
  bfy_buffer_set_changed_cb
            (&local_c8.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_c8.changes);
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bfy_buffer_copyout(&local_c8.buf,8,&local_d0);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_e8,"wanted","bfy_buffer_copyout(&local.buf, wanted, std::data(array))",&local_d4,
             (unsigned_long *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5c6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_f0.data_._0_4_ = 0;
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)local_c8.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_c8.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_e8,"0","std::size(local.changes)",(int *)&local_f0,(unsigned_long *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5c7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_c8);
  return;
}

Assistant:

TEST(Buffer, change_event_copyout) {
    BufferWithReadonlyStrings local;
    auto constexpr wanted = 8;
    auto array = std::array<char, wanted> {};

    local.start_listening_to_changes();
    EXPECT_EQ(wanted, bfy_buffer_copyout(&local.buf, wanted, std::data(array)));
    EXPECT_EQ(0, std::size(local.changes));
}